

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

SrcList * sqlite3SrcListDup(sqlite3 *db,SrcList *p,int flags)

{
  byte bVar1;
  i16 iVar2;
  long lVar3;
  byte bVar4;
  SrcList *pSVar5;
  char *pcVar6;
  Select *pSVar7;
  Expr *pEVar8;
  IdList *pIVar9;
  long lVar10;
  int n;
  long lVar11;
  
  if (p != (SrcList *)0x0) {
    n = 0x70;
    if (0 < p->nSrc) {
      n = p->nSrc * 0x68 + 8;
    }
    pSVar5 = (SrcList *)sqlite3DbMallocRaw(db,n);
    if (pSVar5 != (SrcList *)0x0) {
      iVar2 = p->nSrc;
      pSVar5->nAlloc = iVar2;
      pSVar5->nSrc = iVar2;
      if (p->nSrc < 1) {
        return pSVar5;
      }
      lVar11 = 0x68;
      lVar10 = 0;
      do {
        *(undefined8 *)((long)(pSVar5->a + -1) + lVar11) =
             *(undefined8 *)((long)(p->a + -1) + lVar11);
        pcVar6 = sqlite3DbStrDup(db,*(char **)((long)p->a + lVar11 + -0x60));
        *(char **)((long)pSVar5->a + lVar11 + -0x60) = pcVar6;
        pcVar6 = sqlite3DbStrDup(db,*(char **)((long)p->a + lVar11 + -0x58));
        *(char **)((long)pSVar5->a + lVar11 + -0x58) = pcVar6;
        pcVar6 = sqlite3DbStrDup(db,*(char **)((long)p->a + lVar11 + -0x50));
        *(char **)((long)pSVar5->a + lVar11 + -0x50) = pcVar6;
        *(undefined1 *)((long)pSVar5->a + lVar11 + -0x30) =
             *(undefined1 *)((long)p->a + lVar11 + -0x30);
        *(undefined4 *)((long)pSVar5->a + lVar11 + -0x2c) =
             *(undefined4 *)((long)p->a + lVar11 + -0x2c);
        *(undefined4 *)((long)pSVar5->a + lVar11 + -0x38) =
             *(undefined4 *)((long)p->a + lVar11 + -0x38);
        *(undefined4 *)((long)pSVar5->a + lVar11 + -0x34) =
             *(undefined4 *)((long)p->a + lVar11 + -0x34);
        bVar4 = *(byte *)((long)p->a + lVar11 + -0x2f) & 2;
        bVar1 = *(byte *)((long)pSVar5->a + lVar11 + -0x2f);
        *(byte *)((long)pSVar5->a + lVar11 + -0x2f) = bVar1 & 0xfd | bVar4;
        *(byte *)((long)pSVar5->a + lVar11 + -0x2f) =
             bVar1 & 0xf9 | bVar4 | *(byte *)((long)p->a + lVar11 + -0x2f) & 4;
        pcVar6 = sqlite3DbStrDup(db,*(char **)((long)p->a + lVar11 + -0x10));
        *(char **)((long)pSVar5->a + lVar11 + -0x10) = pcVar6;
        *(byte *)((long)pSVar5->a + lVar11 + -0x2f) =
             *(byte *)((long)pSVar5->a + lVar11 + -0x2f) & 0xfe |
             *(byte *)((long)p->a + lVar11 + -0x2f) & 1;
        *(undefined8 *)((long)pSVar5->a + lVar11 + -8) = *(undefined8 *)((long)p->a + lVar11 + -8);
        lVar3 = *(long *)((long)p->a + lVar11 + -0x48);
        *(long *)((long)pSVar5->a + lVar11 + -0x48) = lVar3;
        if (lVar3 != 0) {
          *(short *)(lVar3 + 0x44) = *(short *)(lVar3 + 0x44) + 1;
        }
        pSVar7 = sqlite3SelectDup(db,*(Select **)((long)p->a + lVar11 + -0x40),flags);
        *(Select **)((long)pSVar5->a + lVar11 + -0x40) = pSVar7;
        pEVar8 = exprDup(db,*(Expr **)((long)p->a + lVar11 + -0x28),flags,(u8 **)0x0);
        *(Expr **)((long)pSVar5->a + lVar11 + -0x28) = pEVar8;
        pIVar9 = sqlite3IdListDup(db,*(IdList **)((long)p->a + lVar11 + -0x20));
        *(IdList **)((long)pSVar5->a + lVar11 + -0x20) = pIVar9;
        *(undefined8 *)((long)pSVar5->a + lVar11 + -0x18) =
             *(undefined8 *)((long)p->a + lVar11 + -0x18);
        lVar10 = lVar10 + 1;
        lVar11 = lVar11 + 0x68;
      } while (lVar10 < p->nSrc);
      return pSVar5;
    }
  }
  return (SrcList *)0x0;
}

Assistant:

SQLITE_PRIVATE SrcList *sqlite3SrcListDup(sqlite3 *db, SrcList *p, int flags){
  SrcList *pNew;
  int i;
  int nByte;
  if( p==0 ) return 0;
  nByte = sizeof(*p) + (p->nSrc>0 ? sizeof(p->a[0]) * (p->nSrc-1) : 0);
  pNew = sqlite3DbMallocRaw(db, nByte );
  if( pNew==0 ) return 0;
  pNew->nSrc = pNew->nAlloc = p->nSrc;
  for(i=0; i<p->nSrc; i++){
    struct SrcList_item *pNewItem = &pNew->a[i];
    struct SrcList_item *pOldItem = &p->a[i];
    Table *pTab;
    pNewItem->pSchema = pOldItem->pSchema;
    pNewItem->zDatabase = sqlite3DbStrDup(db, pOldItem->zDatabase);
    pNewItem->zName = sqlite3DbStrDup(db, pOldItem->zName);
    pNewItem->zAlias = sqlite3DbStrDup(db, pOldItem->zAlias);
    pNewItem->jointype = pOldItem->jointype;
    pNewItem->iCursor = pOldItem->iCursor;
    pNewItem->addrFillSub = pOldItem->addrFillSub;
    pNewItem->regReturn = pOldItem->regReturn;
    pNewItem->isCorrelated = pOldItem->isCorrelated;
    pNewItem->viaCoroutine = pOldItem->viaCoroutine;
    pNewItem->zIndex = sqlite3DbStrDup(db, pOldItem->zIndex);
    pNewItem->notIndexed = pOldItem->notIndexed;
    pNewItem->pIndex = pOldItem->pIndex;
    pTab = pNewItem->pTab = pOldItem->pTab;
    if( pTab ){
      pTab->nRef++;
    }
    pNewItem->pSelect = sqlite3SelectDup(db, pOldItem->pSelect, flags);
    pNewItem->pOn = sqlite3ExprDup(db, pOldItem->pOn, flags);
    pNewItem->pUsing = sqlite3IdListDup(db, pOldItem->pUsing);
    pNewItem->colUsed = pOldItem->colUsed;
  }
  return pNew;
}